

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowFontSelector(char *label)

{
  bool bVar1;
  ImGuiIO *pIVar2;
  ImFont *pIVar3;
  ImFont **ppIVar4;
  ImFont *font;
  int n;
  ImFont *font_current;
  ImGuiIO *io;
  ImVec2 *in_stack_00000098;
  ImGuiSelectableFlags in_stack_000000a0;
  bool in_stack_000000a7;
  char *in_stack_000000a8;
  ImGuiComboFlags in_stack_0000010c;
  char *in_stack_00000110;
  char *in_stack_00000118;
  char *in_stack_ffffffffffffffc0;
  ImVec2 in_stack_ffffffffffffffd0;
  int local_1c;
  
  pIVar2 = GetIO();
  pIVar3 = GetFont();
  ImFont::GetDebugName(pIVar3);
  bVar1 = BeginCombo(in_stack_00000118,in_stack_00000110,in_stack_0000010c);
  if (bVar1) {
    for (local_1c = 0; local_1c < (pIVar2->Fonts->Fonts).Size; local_1c = local_1c + 1) {
      ppIVar4 = ImVector<ImFont_*>::operator[](&pIVar2->Fonts->Fonts,local_1c);
      pIVar3 = *ppIVar4;
      PushID((void *)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffc0 = ImFont::GetDebugName(pIVar3);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,0.0,0.0);
      bVar1 = Selectable(in_stack_000000a8,in_stack_000000a7,in_stack_000000a0,in_stack_00000098);
      if (bVar1) {
        pIVar2->FontDefault = pIVar3;
      }
      PopID();
    }
    EndCombo();
  }
  SameLine((float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),SUB84(in_stack_ffffffffffffffc0,0));
  HelpMarker((char *)0x183a14);
  return;
}

Assistant:

void ImGui::ShowFontSelector(const char* label)
{
    ImGuiIO& io = ImGui::GetIO();
    ImFont* font_current = ImGui::GetFont();
    if (ImGui::BeginCombo(label, font_current->GetDebugName()))
    {
        for (int n = 0; n < io.Fonts->Fonts.Size; n++)
        {
            ImFont* font = io.Fonts->Fonts[n];
            ImGui::PushID((void*)font);
            if (ImGui::Selectable(font->GetDebugName(), font == font_current))
                io.FontDefault = font;
            ImGui::PopID();
        }
        ImGui::EndCombo();
    }
    ImGui::SameLine();
    HelpMarker(
        "- Load additional fonts with io.Fonts->AddFontFromFileTTF().\n"
        "- The font atlas is built when calling io.Fonts->GetTexDataAsXXXX() or io.Fonts->Build().\n"
        "- Read FAQ and docs/FONTS.md for more details.\n"
        "- If you need to add/remove fonts at runtime (e.g. for DPI change), do it before calling NewFrame().");
}